

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

void Curl_dynhds_free(dynhds *dynhds)

{
  ulong local_18;
  size_t i;
  dynhds *dynhds_local;
  
  if ((dynhds->hds != (dynhds_entry **)0x0) && (dynhds->hds_len != 0)) {
    for (local_18 = 0; local_18 < dynhds->hds_len; local_18 = local_18 + 1) {
      entry_free(dynhds->hds[local_18]);
    }
  }
  (*Curl_cfree)(dynhds->hds);
  dynhds->hds = (dynhds_entry **)0x0;
  dynhds->strs_len = 0;
  dynhds->hds_allc = 0;
  dynhds->hds_len = 0;
  return;
}

Assistant:

void Curl_dynhds_free(struct dynhds *dynhds)
{
  DEBUGASSERT(dynhds);
  if(dynhds->hds && dynhds->hds_len) {
    size_t i;
    DEBUGASSERT(dynhds->hds);
    for(i = 0; i < dynhds->hds_len; ++i) {
      entry_free(dynhds->hds[i]);
    }
  }
  Curl_safefree(dynhds->hds);
  dynhds->hds_len = dynhds->hds_allc = dynhds->strs_len = 0;
}